

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FatEntry.cpp
# Opt level: O1

bool __thiscall FatEntry::isCorrect(FatEntry *this)

{
  pointer pcVar1;
  ulong uVar2;
  int iVar3;
  ulong uVar4;
  byte bVar5;
  bool bVar6;
  string local_38;
  
  bVar5 = this->attributes;
  if (bVar5 != 0 && (bVar5 & 0x30) == 0) {
    return false;
  }
  bVar5 = this->cluster == 0 & bVar5 >> 4;
  if (bVar5 == 1) {
    getFilename_abi_cxx11_(&local_38,this);
    iVar3 = std::__cxx11::string::compare((char *)&local_38);
    bVar6 = iVar3 != 0;
  }
  else {
    bVar6 = false;
  }
  if ((bVar5 != 0) &&
     ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2)) {
    operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
  }
  if (bVar6) {
    bVar6 = false;
  }
  else {
    pcVar1 = (this->data)._M_dataplus._M_p;
    iVar3 = isprint((uint)(byte)pcVar1[1]);
    bVar6 = true;
    if (iVar3 == 0) {
      uVar2 = 0xfffffffffffffff7;
      do {
        uVar4 = uVar2;
        if (uVar4 == 0) break;
        iVar3 = isprint((uint)(byte)pcVar1[uVar4 + 0xb]);
        uVar2 = uVar4 + 1;
      } while (iVar3 == 0);
      bVar6 = 0xfffffffffffffff5 < uVar4;
    }
  }
  return bVar6;
}

Assistant:

bool FatEntry::isCorrect()
{
    if (attributes && !(attributes&FAT_ATTRIBUTES_DIR) && !(attributes&FAT_ATTRIBUTES_FILE)) {
        return false;
    }

    if (isDirectory() && cluster == 0 && getFilename()!="..") {
        return false;
    }

    for (int i=1; i<11; i++) {
        if (printable(data[i])) {
            return true;
        }
    }

    return false;
}